

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::BoxedPrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,JavaType type)

{
  LogMessage *other;
  char *pcVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
  case 7:
    pcVar1 = "java.lang.Integer";
    break;
  case 1:
    pcVar1 = "java.lang.Long";
    break;
  case 2:
    pcVar1 = "java.lang.Float";
    break;
  case 3:
    pcVar1 = "java.lang.Double";
    break;
  case 4:
    pcVar1 = "java.lang.Boolean";
    break;
  case 5:
    pcVar1 = "java.lang.String";
    break;
  case 6:
    pcVar1 = "byte[]";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x17b);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  case 8:
    pcVar1 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string BoxedPrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT    : return "java.lang.Integer";
    case JAVATYPE_LONG   : return "java.lang.Long";
    case JAVATYPE_FLOAT  : return "java.lang.Float";
    case JAVATYPE_DOUBLE : return "java.lang.Double";
    case JAVATYPE_BOOLEAN: return "java.lang.Boolean";
    case JAVATYPE_STRING : return "java.lang.String";
    case JAVATYPE_BYTES  : return "byte[]";
    case JAVATYPE_ENUM   : return "java.lang.Integer";
    case JAVATYPE_MESSAGE: return "";

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}